

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_set_Test::~ObjectTest_basic_set_Test(ObjectTest_basic_set_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_set) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, bool);
	OBJECT_BASIC_SET_TEST(obj, signed_char_t);
	OBJECT_BASIC_SET_TEST(obj, unsigned_char_t);
	OBJECT_BASIC_SET_TEST(obj, short);
	OBJECT_BASIC_SET_TEST(obj, int);
	OBJECT_BASIC_SET_TEST(obj, long);
	OBJECT_BASIC_SET_TEST(obj, long_long_t);
	OBJECT_BASIC_SET_TEST(obj, intmax_t);
	OBJECT_BASIC_SET_TEST(obj, float);
	OBJECT_BASIC_SET_TEST(obj, double);
	OBJECT_BASIC_SET_TEST(obj, long_double_t);
	OBJECT_BASIC_SET_TEST(obj, std::u8string);
	OBJECT_BASIC_SET_TEST(obj, object::array_type);

	// const char*
	obj.set(u8"");
	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});

	// std::u8string_view
	obj.set(u8""sv);
	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
}